

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void google::protobuf::compiler::CodeGeneratorResponse_File::SharedDtor(MessageLite *self)

{
  GeneratedCodeInfo *this;
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[1]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 2));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[2]._internal_metadata_);
    this = (GeneratedCodeInfo *)self[3]._vptr_MessageLite;
    if (this != (GeneratedCodeInfo *)0x0) {
      GeneratedCodeInfo::~GeneratedCodeInfo(this);
      operator_delete(this,0x30);
      return;
    }
    return;
  }
  SharedDtor((CodeGeneratorResponse_File *)&stack0xffffffffffffffe0);
}

Assistant:

inline void CodeGeneratorResponse_File::SharedDtor(MessageLite& self) {
  CodeGeneratorResponse_File& this_ = static_cast<CodeGeneratorResponse_File&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.insertion_point_.Destroy();
  this_._impl_.content_.Destroy();
  delete this_._impl_.generated_code_info_;
  this_._impl_.~Impl_();
}